

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderCompiler.cpp
# Opt level: O1

void compileThreadProc(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  FILE *__stream;
  char *pcVar5;
  size_t sVar6;
  undefined8 uVar7;
  string commandLine;
  CompileTask task;
  ostringstream ss;
  char buf [1024];
  long *local_690 [2];
  long local_680 [2];
  undefined1 local_670 [32];
  _Alloc_hider local_650;
  size_type local_648;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_640;
  _Alloc_hider local_630;
  size_type local_628;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_620;
  _Alloc_hider local_610;
  size_type local_608;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_600;
  _Alloc_hider local_5f0;
  size_type local_5e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5e0;
  long *local_5d0;
  long local_5c8;
  long local_5c0 [2];
  ostringstream local_5b0 [112];
  ios_base local_540 [264];
  char local_438 [1032];
  
  while( true ) {
    if (g_Terminate != false) {
      return;
    }
    local_670._0_8_ = local_670 + 0x10;
    local_670._8_8_ = 0;
    local_670[0x10] = '\0';
    local_650._M_p = (pointer)&local_640;
    local_648 = 0;
    local_640._M_local_buf[0] = '\0';
    local_630._M_p = (pointer)&local_620;
    local_628 = 0;
    local_620._M_local_buf[0] = '\0';
    local_610._M_p = (pointer)&local_600;
    local_608 = 0;
    local_600._M_local_buf[0] = '\0';
    local_5f0._M_p = (pointer)&local_5e0;
    local_5e8 = 0;
    local_5e0._M_local_buf[0] = '\0';
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&g_TaskMutex);
    if (iVar2 != 0) break;
    if (g_CompileTasks.super__Vector_base<CompileTask,_std::allocator<CompileTask>_>._M_impl.
        super__Vector_impl_data._M_start ==
        g_CompileTasks.super__Vector_base<CompileTask,_std::allocator<CompileTask>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pthread_mutex_unlock((pthread_mutex_t *)&g_TaskMutex);
      bVar1 = false;
    }
    else {
      std::__cxx11::string::_M_assign((string *)local_670);
      std::__cxx11::string::_M_assign((string *)&local_650);
      std::__cxx11::string::_M_assign((string *)&local_630);
      std::__cxx11::string::_M_assign((string *)&local_610);
      std::__cxx11::string::_M_assign((string *)&local_5f0);
      g_CompileTasks.super__Vector_base<CompileTask,_std::allocator<CompileTask>_>._M_impl.
      super__Vector_impl_data._M_finish =
           g_CompileTasks.super__Vector_base<CompileTask,_std::allocator<CompileTask>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      __gnu_cxx::new_allocator<CompileTask>::destroy<CompileTask>
                ((new_allocator<CompileTask> *)&g_CompileTasks,
                 g_CompileTasks.super__Vector_base<CompileTask,_std::allocator<CompileTask>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      pthread_mutex_unlock((pthread_mutex_t *)&g_TaskMutex);
      if (g_Options.verbose == true) {
        iVar2 = pthread_mutex_lock((pthread_mutex_t *)&g_ReportMutex);
        if (iVar2 == 0) {
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_5f0._M_p,local_5e8);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          pthread_mutex_unlock((pthread_mutex_t *)&g_ReportMutex);
          goto LAB_0010aea5;
        }
        goto LAB_0010b2f6;
      }
LAB_0010aea5:
      local_690[0] = local_680;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_690,local_5f0._M_p,local_5f0._M_p + local_5e8);
      std::__cxx11::string::append((char *)local_690);
      __stream = popen((char *)local_690[0],"r");
      bVar1 = __stream != (FILE *)0x0;
      if (__stream == (FILE *)0x0) {
        iVar2 = pthread_mutex_lock((pthread_mutex_t *)&g_ReportMutex);
        if (iVar2 != 0) goto LAB_0010b2fd;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ERROR: cannot run ",0x12);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,g_Options.compilerPath._M_dataplus._M_p,
                            g_Options.compilerPath._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        g_CompileSuccess = false;
        g_Terminate = true;
        pthread_mutex_unlock((pthread_mutex_t *)&g_ReportMutex);
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_5b0);
        while (pcVar5 = fgets(local_438,0x400,__stream), pcVar5 != (char *)0x0) {
          sVar6 = strlen(local_438);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,local_438,sVar6);
        }
        iVar3 = pclose(__stream);
        LOCK();
        g_ProcessedTaskCount.super___atomic_base<int>._M_i =
             (__atomic_base<int>)((int)g_ProcessedTaskCount.super___atomic_base<int>._M_i + 1);
        UNLOCK();
        iVar2 = pthread_mutex_lock((pthread_mutex_t *)&g_ReportMutex);
        if (iVar2 != 0) goto LAB_0010b2ef;
        pcVar5 = "FAIL ";
        if (iVar3 == 0) {
          pcVar5 = " OK  ";
        }
        sprintf(local_438,"[%5.1f%%] %s %s %s:%s %s",
                (double)(((float)(int)g_ProcessedTaskCount.super___atomic_base<int>._M_i /
                         (float)g_OriginalTaskCount) * 100.0),
                g_PlatformName_abi_cxx11_._M_dataplus._M_p,pcVar5,local_650._M_p,local_630._M_p,
                local_610._M_p);
        sVar6 = strlen(local_438);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_438,sVar6);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
        std::ostream::put('\x10');
        std::ostream::flush();
        if ((iVar3 != 0) && (g_Terminate == false)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"ERRORS for ",0xb);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_650._M_p,local_648);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,local_630._M_p,local_628);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,local_610._M_p,local_608);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          std::__cxx11::stringbuf::str();
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)local_5d0,local_5c8);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          if (local_5d0 != local_5c0) {
            operator_delete(local_5d0,local_5c0[0] + 1);
          }
          g_CompileSuccess = false;
        }
        pthread_mutex_unlock((pthread_mutex_t *)&g_ReportMutex);
        std::__cxx11::ostringstream::~ostringstream(local_5b0);
        std::ios_base::~ios_base(local_540);
      }
      if (local_690[0] != local_680) {
        operator_delete(local_690[0],local_680[0] + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f0._M_p != &local_5e0) {
      operator_delete(local_5f0._M_p,
                      CONCAT71(local_5e0._M_allocated_capacity._1_7_,local_5e0._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_610._M_p != &local_600) {
      operator_delete(local_610._M_p,
                      CONCAT71(local_600._M_allocated_capacity._1_7_,local_600._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_630._M_p != &local_620) {
      operator_delete(local_630._M_p,
                      CONCAT71(local_620._M_allocated_capacity._1_7_,local_620._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_650._M_p != &local_640) {
      operator_delete(local_650._M_p,
                      CONCAT71(local_640._M_allocated_capacity._1_7_,local_640._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_670._0_8_ != local_670 + 0x10) {
      operator_delete((void *)local_670._0_8_,CONCAT71(local_670._17_7_,local_670[0x10]) + 1);
    }
    if (!bVar1) {
      return;
    }
  }
  iVar2 = std::__throw_system_error(iVar2);
LAB_0010b2ef:
  iVar2 = std::__throw_system_error(iVar2);
LAB_0010b2f6:
  iVar2 = std::__throw_system_error(iVar2);
LAB_0010b2fd:
  uVar7 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)&g_ReportMutex);
  std::__cxx11::ostringstream::~ostringstream(local_5b0);
  std::ios_base::~ios_base(local_540);
  if (local_690[0] != local_680) {
    operator_delete(local_690[0],local_680[0] + 1);
  }
  CompileTask::~CompileTask((CompileTask *)local_670);
  _Unwind_Resume(uVar7);
}

Assistant:

void compileThreadProc()
{
	while (!g_Terminate)
	{
		CompileTask task;
		{
			lock_guard<mutex> guard(g_TaskMutex);
			if (g_CompileTasks.empty())
				return;

			task = g_CompileTasks[g_CompileTasks.size() - 1];
			g_CompileTasks.pop_back();
		}

		if (g_Options.verbose)
		{
			lock_guard<mutex> guard(g_ReportMutex);
			cout << task.commandLine << endl;
		}

		string commandLine = task.commandLine + " 2>&1";

		FILE* pipe = popen(commandLine.c_str(), "r");
		if (!pipe)
		{
			lock_guard<mutex> guard(g_ReportMutex);
			cout << "ERROR: cannot run " << g_Options.compilerPath << endl;
			g_CompileSuccess = false;
			g_Terminate = true;
			return;
		}

		ostringstream ss;
		char buf[1024];
		while (fgets(buf, sizeof(buf), pipe))
			ss << buf;

		int result = pclose(pipe);
		g_ProcessedTaskCount++;

		{
			lock_guard<mutex> guard(g_ReportMutex);

			const char* resultCode = (result == 0) ? " OK  " : "FAIL ";
			float progress = (float)g_ProcessedTaskCount / (float)g_OriginalTaskCount;

			sprintf(buf, "[%5.1f%%] %s %s %s:%s %s", 
				progress * 100.f, 
				g_PlatformName.c_str(), 
				resultCode, 
				task.shaderName.c_str(), 
				task.entryPoint.c_str(), 
				task.combinedDefines.c_str());

			cout << buf << endl;
 
			if (result != 0 && !g_Terminate)
			{
				cout << "ERRORS for " << task.shaderName << ":" << task.entryPoint << " " << task.combinedDefines << ": " << endl;
				cout << ss.str() << endl;
				g_CompileSuccess = false;
			}
		}
	}
}